

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O3

ostream * __thiscall absl::operator<<(absl *this,ostream *os,uint128 v)

{
  absl *paVar1;
  uint *puVar2;
  uint uVar3;
  long lVar4;
  uint128 dividend;
  absl aVar5;
  ostream *poVar6;
  char cVar7;
  ulong uVar8;
  long lVar9;
  undefined8 uVar10;
  uint128 dividend_00;
  uint128 divisor;
  uint128 divisor_00;
  string rep;
  uint128 low;
  ostringstream os_1;
  undefined1 auStack_208 [8];
  uint64_t local_200;
  char *local_1f8;
  ulong local_1f0;
  char local_1e8 [16];
  uint128 local_1d8;
  uint128 local_1c8;
  uint128 local_1b8;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  local_200 = v.lo_;
  uVar3 = *(uint *)(this + *(long *)(*(long *)this + -0x18) + 0x18);
  if ((uVar3 & 0x4a) == 8) {
    uVar10 = 0xf;
    uVar8 = 0x1000000000000000;
  }
  else if ((uVar3 & 0x4a) == 0x40) {
    uVar10 = 0x15;
    uVar8 = 0x8000000000000000;
  }
  else {
    uVar10 = 0x13;
    uVar8 = 10000000000000000000;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffbdb5 | uVar3 & 0x424a;
  local_1b8.hi_ = local_200;
  dividend_00.hi_ = local_200;
  dividend_00.lo_ = (uint64_t)os;
  divisor.hi_ = 0;
  divisor.lo_ = uVar8;
  local_1b8.lo_ = (uint64_t)os;
  anon_unknown_2::DivModImpl(dividend_00,divisor,&local_1b8,&local_1c8);
  dividend.hi_ = local_1b8.hi_;
  dividend.lo_ = local_1b8.lo_;
  divisor_00.hi_ = 0;
  divisor_00.lo_ = uVar8;
  anon_unknown_2::DivModImpl(dividend,divisor_00,&local_1b8,&local_1d8);
  if ((ostream *)local_1b8.lo_ == (ostream *)0x0) {
    if (local_1d8.lo_ != 0) {
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
      *puVar2 = *puVar2 & 0xfffffdff;
      lVar4 = *(long *)(local_1a8[0] + -0x18);
      if (acStack_c8[lVar4 + 1] == '\0') {
        std::ios::widen((char)auStack_208 + (char)lVar4 + '`');
        acStack_c8[lVar4 + 1] = '\x01';
      }
      acStack_c8[lVar4] = '0';
      goto LAB_0022d62b;
    }
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar2 = *puVar2 & 0xfffffdff;
    lVar4 = *(long *)(local_1a8[0] + -0x18);
    if (acStack_c8[lVar4 + 1] == '\0') {
      std::ios::widen((char)auStack_208 + (char)lVar4 + '`');
      acStack_c8[lVar4 + 1] = '\x01';
    }
    acStack_c8[lVar4] = '0';
    *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = uVar10;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
LAB_0022d62b:
    *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = uVar10;
  }
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  lVar4 = *(long *)this;
  uVar8 = *(ulong *)(this + *(long *)(lVar4 + -0x18) + 0x10);
  *(undefined8 *)(this + *(long *)(lVar4 + -0x18) + 0x10) = 0;
  lVar9 = uVar8 - local_1f0;
  if (uVar8 < local_1f0 || lVar9 == 0) goto LAB_0022d780;
  cVar7 = (char)lVar9;
  if (((byte)uVar3 & 0xb0) == 0x10) {
    if (((uVar3 & 0x24a) != 0x208) || (os == (ostream *)0x0 && local_200 == 0)) goto LAB_0022d701;
    paVar1 = this + *(long *)(lVar4 + -0x18);
    if (this[*(long *)(lVar4 + -0x18) + 0xe1] != (absl)0x1) {
      aVar5 = (absl)std::ios::widen((char)paVar1);
      paVar1[0xe0] = aVar5;
      paVar1[0xe1] = (absl)0x1;
    }
    uVar8 = 2;
  }
  else {
    if ((uVar3 & 0xb0) == 0x20) {
      paVar1 = this + *(long *)(lVar4 + -0x18);
      if (this[*(long *)(lVar4 + -0x18) + 0xe1] != (absl)0x1) {
        aVar5 = (absl)std::ios::widen((char)paVar1);
        paVar1[0xe0] = aVar5;
        paVar1[0xe1] = (absl)0x1;
      }
      std::__cxx11::string::_M_replace_aux((ulong)&local_1f8,local_1f0,0,cVar7);
      goto LAB_0022d780;
    }
LAB_0022d701:
    paVar1 = this + *(long *)(lVar4 + -0x18);
    if (this[*(long *)(lVar4 + -0x18) + 0xe1] != (absl)0x1) {
      aVar5 = (absl)std::ios::widen((char)paVar1);
      paVar1[0xe0] = aVar5;
      paVar1[0xe1] = (absl)0x1;
    }
    uVar8 = 0;
  }
  std::__cxx11::string::insert((ulong)&local_1f8,uVar8,cVar7);
LAB_0022d780:
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,local_1f8,local_1f0);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  return poVar6;
}

Assistant:

std::ostream& operator<<(std::ostream& os, uint128 v) {
  std::ios_base::fmtflags flags = os.flags();
  std::string rep = Uint128ToFormattedString(v, flags);

  // Add the requisite padding.
  std::streamsize width = os.width(0);
  if (static_cast<size_t>(width) > rep.size()) {
    std::ios::fmtflags adjustfield = flags & std::ios::adjustfield;
    if (adjustfield == std::ios::left) {
      rep.append(width - rep.size(), os.fill());
    } else if (adjustfield == std::ios::internal &&
               (flags & std::ios::showbase) &&
               (flags & std::ios::basefield) == std::ios::hex && v != 0) {
      rep.insert(2, width - rep.size(), os.fill());
    } else {
      rep.insert(0, width - rep.size(), os.fill());
    }
  }

  return os << rep;
}